

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_flatten(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int map)

{
  JSValueUnion JVar1;
  JSValue mapperFunction;
  JSValue thisArg;
  int iVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  uint uVar5;
  ulong uVar6;
  JSValue JVar7;
  JSValue JVar8;
  int depthNum;
  int64_t sourceLen;
  int local_60;
  int local_5c;
  int32_t local_58;
  undefined4 uStack_54;
  int64_t iStack_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  int64_t local_38;
  
  local_5c = map;
  JVar7 = JS_ToObject(ctx,this_val);
  JVar3 = JVar7.u;
  iVar2 = js_get_length64(ctx,&local_38,JVar7);
  if (iVar2 == 0) {
    local_60 = 1;
    local_58 = 0;
    iStack_50 = 3;
    local_48.float64 = local_48.float64 & 0xffffffff00000000;
    iStack_40 = 3;
    if (local_5c == 0) {
      if (0 < argc) {
        iVar4 = argv->tag;
        uVar5 = (uint)iVar4;
        if (uVar5 != 3) {
          JVar1 = (JSValueUnion)(argv->u).ptr;
          if (0xfffffff4 < uVar5) {
            *(int *)JVar1.ptr = *JVar1.ptr + 1;
          }
          JVar8.tag = iVar4;
          JVar8.u.ptr = JVar1.ptr;
          iVar2 = JS_ToInt32SatFree(ctx,&local_60,JVar8);
          if (iVar2 < 0) goto LAB_00167839;
        }
      }
    }
    else {
      iStack_50 = argv->tag;
      local_58 = (argv->u).int32;
      uStack_54 = SUB84(argv->u,4);
      if (1 < argc) {
        local_48 = (JSValueUnion)argv[1].u.ptr;
        iStack_40 = argv[1].tag;
      }
      iVar2 = check_function(ctx,*argv);
      if (iVar2 != 0) goto LAB_00167839;
    }
    JVar8 = JS_ArraySpeciesCreate(ctx,JVar7,(JSValue)ZEXT816(0));
    uVar6 = (ulong)JVar8.u.ptr >> 0x20;
    if (((int)JVar8.tag != 6) &&
       (mapperFunction.u._4_4_ = uStack_54, mapperFunction.u.int32 = local_58,
       mapperFunction.tag = iStack_50, thisArg.tag = iStack_40, thisArg.u.ptr = local_48.ptr,
       iVar4 = JS_FlattenIntoArray(ctx,JVar8,JVar7,local_38,0,local_60,mapperFunction,thisArg),
       -1 < iVar4)) {
      if ((uint)JVar7.tag < 0xfffffff5) {
        return JVar8;
      }
      iVar2 = *JVar3.ptr;
      *(int *)JVar3.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return JVar8;
      }
      __JS_FreeValueRT(ctx->rt,JVar7);
      return JVar8;
    }
  }
  else {
LAB_00167839:
    JVar8 = (JSValue)(ZEXT816(3) << 0x40);
    uVar6 = 0;
  }
  if ((0xfffffff4 < (uint)JVar7.tag) &&
     (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar7);
  }
  JVar3.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar6 << 0x20);
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
    JVar7.tag = JVar8.tag;
    JVar7.u.ptr = JVar3.ptr;
    __JS_FreeValueRT(ctx->rt,JVar7);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_flatten(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int map)
{
    JSValue obj, arr;
    JSValueConst mapperFunction, thisArg;
    int64_t sourceLen;
    int depthNum;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &sourceLen, obj))
        goto exception;

    depthNum = 1;
    mapperFunction = JS_UNDEFINED;
    thisArg = JS_UNDEFINED;
    if (map) {
        mapperFunction = argv[0];
        if (argc > 1) {
            thisArg = argv[1];
        }
        if (check_function(ctx, mapperFunction))
            goto exception;
    } else {
        if (argc > 0 && !JS_IsUndefined(argv[0])) {
            if (JS_ToInt32Sat(ctx, &depthNum, argv[0]) < 0)
                goto exception;
        }
    }
    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    if (JS_FlattenIntoArray(ctx, arr, obj, sourceLen, 0, depthNum,
                            mapperFunction, thisArg) < 0)
        goto exception;
    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}